

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAlignedObjectArray.h
# Opt level: O0

btBvhSubtreeInfo * __thiscall
btAlignedObjectArray<btBvhSubtreeInfo>::expand
          (btAlignedObjectArray<btBvhSubtreeInfo> *this,btBvhSubtreeInfo *fillValue)

{
  int iVar1;
  int iVar2;
  undefined8 *puVar3;
  btAlignedObjectArray<btBvhSubtreeInfo> *in_RSI;
  btAlignedObjectArray<btBvhSubtreeInfo> *in_RDI;
  int sz;
  int _Count;
  
  iVar1 = size(in_RDI);
  _Count = iVar1;
  iVar2 = capacity(in_RDI);
  if (iVar1 == iVar2) {
    iVar1 = size(in_RDI);
    allocSize(in_RDI,iVar1);
    reserve(in_RSI,_Count);
  }
  in_RDI->m_size = in_RDI->m_size + 1;
  puVar3 = (undefined8 *)btBvhSubtreeInfo::operator_new(0x20,in_RDI->m_data + _Count);
  *puVar3 = *(undefined8 *)in_RSI;
  puVar3[1] = *(undefined8 *)&in_RSI->m_capacity;
  puVar3[2] = in_RSI->m_data;
  puVar3[3] = *(undefined8 *)&in_RSI->m_ownsMemory;
  return in_RDI->m_data + _Count;
}

Assistant:

SIMD_FORCE_INLINE	T&  expand( const T& fillValue=T())
		{	
			const BT_REGISTER int sz = size();
			if( sz == capacity() )
			{
				reserve( allocSize(size()) );
			}
			m_size++;
#ifdef BT_USE_PLACEMENT_NEW
			new (&m_data[sz]) T(fillValue); //use the in-place new (not really allocating heap memory)
#endif

			return m_data[sz];		
		}